

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O3

int al_ustr_offset(ALLEGRO_USTR *us,int index)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  uchar *puVar7;
  uint uVar8;
  
  if (index < 0) {
    sVar4 = al_ustr_length(us);
    index = (int)sVar4 + index;
  }
  if (index < 1) {
    iVar3 = 0;
  }
  else {
    uVar6 = 0;
    do {
      iVar3 = (int)uVar6;
      if (us == (ALLEGRO_USTR *)0x0) {
        puVar7 = (uchar *)0x0;
        uVar8 = 0;
      }
      else {
        puVar7 = us->data;
        uVar8 = us->slen;
        if ((int)uVar8 < 1) {
          uVar8 = 0;
        }
      }
      if ((int)uVar8 <= iVar3) {
        return iVar3;
      }
      uVar5 = (long)iVar3;
      while (uVar6 = (ulong)uVar8, (ulong)uVar8 - 1 != uVar5) {
        lVar2 = uVar5 + 1;
        uVar6 = uVar5 + 1;
        if ((-1 < (char)puVar7[lVar2]) || (uVar5 = uVar6, puVar7[lVar2] - 0xc0 < 0x3e)) break;
      }
      iVar3 = (int)uVar6;
      bVar1 = 1 < index;
      index = index + -1;
    } while (bVar1);
  }
  return iVar3;
}

Assistant:

int al_ustr_offset(const ALLEGRO_USTR *us, int index)
{
   int pos = 0;

   if (index < 0)
      index += al_ustr_length(us);

   while (index-- > 0) {
      if (!al_ustr_next(us, &pos))
         return pos;
   }

   return pos;
}